

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O3

void __thiscall miniros::RPCManager::releaseXMLRPCClient(RPCManager *this,XmlRpcClient *c)

{
  pointer __dest;
  int iVar1;
  pointer pCVar2;
  pointer __src;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->clients_mutex_);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  pCVar2 = (this->clients_).
           super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __dest = pCVar2;
  do {
    if (pCVar2 == (this->clients_).
                  super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001f7386:
      pthread_mutex_unlock((pthread_mutex_t *)&this->clients_mutex_);
      return;
    }
    __src = __dest + 1;
    if (pCVar2->client_ == c) {
      if (((this->shutting_down_)._M_base._M_i & 1U) == 0) {
        pCVar2->in_use_ = false;
      }
      else {
        (*(pCVar2->client_->super_XmlRpcSource)._vptr_XmlRpcSource[2])();
        if (pCVar2->client_ != (XmlRpcClient *)0x0) {
          (*(pCVar2->client_->super_XmlRpcSource)._vptr_XmlRpcSource[1])();
        }
        pCVar2 = (this->clients_).
                 super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__src != pCVar2) {
          memmove(__dest,__src,(long)pCVar2 - (long)__src);
          pCVar2 = (this->clients_).
                   super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        (this->clients_).
        super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar2 + -1;
      }
      goto LAB_001f7386;
    }
    pCVar2 = pCVar2 + 1;
    __dest = __src;
  } while( true );
}

Assistant:

void RPCManager::releaseXMLRPCClient(XmlRpcClient *c)
{
  std::scoped_lock<std::mutex> lock(clients_mutex_);

  for (auto i = clients_.begin(); i != clients_.end(); ++i)
  {
    if (c == i->client_)
    {
      if (shutting_down_)
      {
        // if we are shutting down we won't be re-using the client
        i->client_->close();
        delete i->client_;
        clients_.erase(i);
      }
      else
      {
        i->in_use_ = false;
      }
      break;
    }
  }
}